

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

Database_Result * __thiscall
Database::Query(Database_Result *__return_storage_ptr__,Database *this,char *format,...)

{
  unsigned_long uVar1;
  char in_AL;
  Database_QueryFailed *this_00;
  size_t sVar2;
  anon_union_8_2_1ccce1b9_for_impl__0 *paVar3;
  char *pcVar4;
  undefined8 in_RCX;
  ulong uVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_230;
  undefined8 *local_208;
  uint *local_1f0;
  uint local_1b8 [6];
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  allocator local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [32];
  string local_b0;
  char *local_90;
  char *p;
  unsigned_long esclen;
  char *escret;
  char *tempc;
  string local_68 [4];
  int tempi;
  string finalquery;
  va_list ap;
  char *format_local;
  Database *this_local;
  
  if (in_AL != '\0') {
    local_188 = in_XMM0_Qa;
    local_178 = in_XMM1_Qa;
    local_168 = in_XMM2_Qa;
    local_158 = in_XMM3_Qa;
    local_148 = in_XMM4_Qa;
    local_138 = in_XMM5_Qa;
    local_128 = in_XMM6_Qa;
    local_118 = in_XMM7_Qa;
  }
  local_1a0 = in_RCX;
  local_198 = in_R8;
  local_190 = in_R9;
  if ((this->connected & 1U) != 0) {
    ap[0]._0_8_ = &stack0x00000008;
    finalquery.field_2._12_4_ = 0x30;
    finalquery.field_2._8_4_ = 0x18;
    std::__cxx11::string::string(local_68);
    for (local_90 = format; *local_90 != '\0'; local_90 = local_90 + 1) {
      if (*local_90 == '#') {
        if ((uint)finalquery.field_2._8_4_ < 0x29) {
          local_1f0 = (uint *)((long)local_1b8 + (long)(int)finalquery.field_2._8_4_);
          finalquery.field_2._8_4_ = finalquery.field_2._8_4_ + 8;
          uVar5 = (ulong)(uint)finalquery.field_2._8_4_;
        }
        else {
          local_1f0 = (uint *)ap[0]._0_8_;
          uVar5 = ap[0]._0_8_ + 8;
          ap[0]._0_8_ = uVar5;
        }
        tempc._4_4_ = *local_1f0;
        util::to_string_abi_cxx11_(&local_b0,(util *)(ulong)tempc._4_4_,(int)uVar5);
        std::__cxx11::string::operator+=(local_68,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      else if (*local_90 == '@') {
        if ((uint)finalquery.field_2._8_4_ < 0x29) {
          local_208 = (undefined8 *)((long)local_1b8 + (long)(int)finalquery.field_2._8_4_);
          finalquery.field_2._8_4_ = finalquery.field_2._8_4_ + 8;
        }
        else {
          local_208 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        pcVar4 = (char *)*local_208;
        escret = pcVar4;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_d0,pcVar4,&local_d1);
        std::__cxx11::string::operator+=(local_68,local_d0);
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator(&local_d1);
      }
      else if (*local_90 == '$') {
        if ((uint)finalquery.field_2._8_4_ < 0x29) {
          local_230 = (undefined8 *)((long)local_1b8 + (long)(int)finalquery.field_2._8_4_);
          finalquery.field_2._8_4_ = finalquery.field_2._8_4_ + 8;
        }
        else {
          local_230 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        escret = (char *)*local_230;
        if (this->engine == MySQL) {
          sVar2 = strlen(escret);
          tempc._4_4_ = (uint)sVar2;
          esclen = (unsigned_long)operator_new__((long)(int)(tempc._4_4_ * 2 + 1));
          paVar3 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::
                    operator->(&this->impl)->field_0;
          pcVar4 = (char *)mysql_real_escape_string
                                     (paVar3->mysql_handle,esclen,escret,(long)(int)tempc._4_4_);
          uVar1 = esclen;
          p = pcVar4;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_f8,(char *)uVar1,(ulong)pcVar4,&local_f9);
          std::__cxx11::string::operator+=(local_68,local_f8);
          std::__cxx11::string::~string(local_f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_f9);
          if (esclen != 0) {
            operator_delete__((void *)esclen);
          }
        }
        else if (this->engine == SQLite) {
          esclen = sqlite3_mprintf("%q",escret);
          std::__cxx11::string::operator+=(local_68,(char *)esclen);
          sqlite3_free(esclen);
        }
      }
      else {
        std::__cxx11::string::operator+=(local_68,*local_90);
      }
    }
    pcVar4 = (char *)std::__cxx11::string::c_str();
    RawQuery(__return_storage_ptr__,this,pcVar4,false);
    std::__cxx11::string::~string(local_68);
    return __return_storage_ptr__;
  }
  this_00 = (Database_QueryFailed *)__cxa_allocate_exception(0x10);
  Database_QueryFailed::Database_QueryFailed(this_00,"Not connected to database.");
  __cxa_throw(this_00,&Database_QueryFailed::typeinfo,Database_QueryFailed::~Database_QueryFailed);
}

Assistant:

Database_Result Database::Query(const char *format, ...)
{
	if (!this->connected)
	{
		throw Database_QueryFailed("Not connected to database.");
	}

	std::va_list ap;
	va_start(ap, format);

	std::string finalquery;
	int tempi;
	char *tempc;
	char *escret;
	unsigned long esclen;

	for (const char *p = format; *p != '\0'; ++p)
	{
		if (*p == '#')
		{
			tempi = va_arg(ap,int);
			finalquery += util::to_string(tempi);
		}
		else if (*p == '@')
		{
			tempc = va_arg(ap,char *);
			finalquery += static_cast<std::string>(tempc);
		}
		else if (*p == '$')
		{
			tempc = va_arg(ap,char *);
			switch (this->engine)
			{
#ifdef DATABASE_MYSQL
				case MySQL:
					tempi = strlen(tempc);
					escret = new char[tempi*2+1];
					esclen = mysql_real_escape_string(this->impl->mysql_handle, escret, tempc, tempi);
					finalquery += std::string(escret, esclen);
					delete[] escret;
					break;
#endif // DATABASE_MYSQL

#ifdef DATABASE_SQLITE
				case SQLite:
					escret = sqlite3_mprintf("%q",tempc);
					finalquery += escret;
					sqlite3_free(escret);
					break;
#endif // DATABASE_SQLITE
			}
		}
		else
		{
			finalquery += *p;
		}
	}

	va_end(ap);

	return this->RawQuery(finalquery.c_str());
}